

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

IntrusiveList<SynBase> ParseExpressions(ParseContext *ctx)

{
  IntrusiveList<SynBase> IVar1;
  SynBase *node;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynBase> local_28;
  
  local_28.head = (SynBase *)0x0;
  local_28.tail = (SynBase *)0x0;
  node = ParseExpression(ctx);
  while (node != (SynBase *)0x0) {
    IntrusiveList<SynBase>::push_back(&local_28,node);
    node = ParseExpression(ctx);
  }
  IVar1.tail = local_28.tail;
  IVar1.head = local_28.head;
  return IVar1;
}

Assistant:

IntrusiveList<SynBase> ParseExpressions(ParseContext &ctx)
{
	IntrusiveList<SynBase> expressions;

	while(SynBase* expression = ParseExpression(ctx))
		expressions.push_back(expression);

	return expressions;
}